

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidPolicyMappingTest2Subpart1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section10InvalidPolicyMappingTest2Subpart1
          (Section10InvalidPolicyMappingTest2Subpart1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section10InvalidPolicyMappingTest2Subpart1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section10InvalidPolicyMappingTest2Subpart1(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidPolicyMappingTest2Subpart1) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "Mapping1to2CACert",
                               "InvalidPolicyMappingTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "Mapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.2";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}